

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O1

void __thiscall
polyscope::SurfaceMeshQuantity::SurfaceMeshQuantity
          (SurfaceMeshQuantity *this,string *name,SurfaceMesh *parentStructure,bool dominates)

{
  pointer pcVar1;
  string local_48;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + name->_M_string_length);
  QuantityS<polyscope::SurfaceMesh>::QuantityS
            (&this->super_QuantityS<polyscope::SurfaceMesh>,&local_48,parentStructure,dominates);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (this->super_QuantityS<polyscope::SurfaceMesh>).super_Quantity._vptr_Quantity =
       (_func_int **)&PTR__Quantity_005f7808;
  return;
}

Assistant:

SurfaceMeshQuantity::SurfaceMeshQuantity(std::string name, SurfaceMesh& parentStructure, bool dominates)
    : QuantityS<SurfaceMesh>(name, parentStructure, dominates) {}